

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_test.cc
# Opt level: O0

void __thiscall
lf::mesh::utils::test::test_mesh_utils_count_test_Test::~test_mesh_utils_count_test_Test
          (test_mesh_utils_count_test_Test *this)

{
  test_mesh_utils_count_test_Test *this_local;
  
  ~test_mesh_utils_count_test_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_mesh_utils, count_test) {
  std::cout << "Test for counting of super-entities" << std::endl;
  // Building the test mesh
  auto mesh_p = lf::mesh::test_utils::GenerateHybrid2DTestMesh();

  EXPECT_EQ(mesh_p->NumEntities(0), 9) << "Test mesh: 9 cells expected!";
  EXPECT_EQ(mesh_p->NumEntities(1), 18) << "Test mesh: 18 edges expected!";
  EXPECT_EQ(mesh_p->NumEntities(2), 10) << "Test mesh: 10 nodes expected!";

  auto cells_at_edges{CountNumSuperEntities(mesh_p, 1, 1)};
  for (const lf::mesh::Entity* edge : mesh_p->Entities(1)) {
    std::cout << cells_at_edges(*edge) << " cells @ " << *edge << ' '
              << mesh_p->Index(*edge) << std::endl;
  }
  auto edges_at_vertices{CountNumSuperEntities(mesh_p, 2, 1)};
  for (const lf::mesh::Entity* node : mesh_p->Entities(2)) {
    std::cout << edges_at_vertices(*node) << " edges @ " << *node << ' '
              << mesh_p->Index(*node) << std::endl;
  }
  auto cells_at_nodes{CountNumSuperEntities(mesh_p, 2, 2)};
  for (const lf::mesh::Entity* node : mesh_p->Entities(2)) {
    std::cout << cells_at_nodes(*node) << " cells @ " << *node << ' '
              << mesh_p->Index(*node) << std::endl;
  }
}